

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyDataSPKM::CheckDecryptionKey(LegacyDataSPKM *this,CKeyingMaterial *master_key)

{
  span<const_unsigned_char,_18446744073709551615UL> crypted_secret;
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  byte bVar2;
  reference ppVar3;
  runtime_error *this_00;
  CKeyingMaterial *in_RSI;
  long in_RDI;
  long lVar4;
  long in_FS_OFFSET;
  Level in_stack_00000030;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret;
  CPubKey *vchPubKey;
  bool keyFail;
  bool keyPass;
  CKey key;
  WalletBatch batch;
  const_iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  WalletDatabase *in_stack_fffffffffffffe90;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  CPubKey *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffec0;
  __extent_storage<18446744073709551615UL> keyMeta;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffec8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret_00;
  CKey *in_stack_fffffffffffffed0;
  WalletBatch *this_01;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  int source_line;
  ConstevalFormatString<0U> in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  byte bVar5;
  CKeyingMaterial *pCVar6;
  long lVar7;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  WalletBatch local_38 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (char *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             SUB41((uint)in_stack_fffffffffffffea8 >> 0x18,0));
  bVar1 = std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          ::empty((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  if (!bVar1) {
    __assert_fail("mapKeys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0xef,
                  "virtual bool wallet::LegacyDataSPKM::CheckDecryptionKey(const CKeyingMaterial &)"
                 );
  }
  lVar4 = in_RDI + 0xe8;
  bVar2 = std::
          map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::empty((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  bVar5 = 0;
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::begin((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           *)in_stack_fffffffffffffe90);
  std::
  _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),(iterator *)0xa1262b);
  (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             SUB41((uint)in_stack_fffffffffffffe8c >> 0x18,0));
  while( true ) {
    std::
    map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           *)in_stack_fffffffffffffe90);
    std::
    _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),(iterator *)0xa12693
              );
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe98,(_Self *)in_stack_fffffffffffffe90);
    source_line = (int)((ulong)lVar4 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_01 = local_38;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    keyMeta._M_extent_value = (size_t)&ppVar3->second;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    vchCryptedSecret_00 = &(ppVar3->second).second;
    CKey::CKey((CKey *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    pCVar6 = in_RSI;
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              (in_stack_fffffffffffffe98,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90);
    crypted_secret._M_extent._M_extent_value = keyMeta._M_extent_value;
    crypted_secret._M_ptr = (pointer)vchCryptedSecret_00;
    in_stack_fffffffffffffef7 =
         DecryptKey(in_RSI,crypted_secret,(CPubKey *)this_01,in_stack_fffffffffffffed0);
    in_RSI = pCVar6;
    if ((bool)in_stack_fffffffffffffef7) {
      bVar2 = 1;
      if ((*(byte *)(in_RDI + 0x1f8) & 1) == 0) {
        in_stack_fffffffffffffed0 = (CKey *)(in_RDI + 0x200);
        CPubKey::GetID(in_stack_fffffffffffffeb0);
        std::
        map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
        ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                      *)in_stack_fffffffffffffeb0,
                     (key_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        WalletBatch::WriteCryptedKey
                  (this_01,(CPubKey *)in_stack_fffffffffffffed0,vchCryptedSecret_00,
                   (CKeyMetadata *)keyMeta._M_extent_value);
        bVar1 = false;
        in_RSI = pCVar6;
      }
      else {
        bVar1 = true;
      }
    }
    else {
      bVar5 = 1;
      bVar1 = true;
    }
    CKey::~CKey((CKey *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    source_line = (int)((ulong)lVar4 >> 0x20);
    if (bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  if (((bVar2 & 1) == 0) || ((bVar5 & 1) == 0)) {
    if (((bVar5 & 1) == 0) && ((bVar2 & 1) != 0)) {
      *(undefined1 *)(in_RDI + 0x1f8) = 1;
      bVar1 = false;
    }
    else {
      in_stack_ffffffffffffff5f = 0;
      bVar1 = true;
    }
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (!bVar1) {
      in_stack_ffffffffffffff5f = 1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return (bool)(in_stack_ffffffffffffff5f & 1);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0);
    logging_function._M_str._0_7_ = in_stack_ffffffffffffff58;
    logging_function._M_len = lVar7;
    logging_function._M_str._7_1_ = in_stack_ffffffffffffff5f;
    source_file._M_len._6_1_ = bVar5;
    source_file._M_len._0_6_ = in_stack_ffffffffffffff40;
    source_file._M_len._7_1_ = bVar2;
    source_file._M_str = (char *)in_RSI;
    LogPrintFormatInternal<>
              (logging_function,source_file,source_line,
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_00000030,
               in_stack_ffffffffffffff38);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt."
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::CheckDecryptionKey(const CKeyingMaterial& master_key)
{
    {
        LOCK(cs_KeyStore);
        assert(mapKeys.empty());

        bool keyPass = mapCryptedKeys.empty(); // Always pass when there are no encrypted keys
        bool keyFail = false;
        CryptedKeyMap::const_iterator mi = mapCryptedKeys.begin();
        WalletBatch batch(m_storage.GetDatabase());
        for (; mi != mapCryptedKeys.end(); ++mi)
        {
            const CPubKey &vchPubKey = (*mi).second.first;
            const std::vector<unsigned char> &vchCryptedSecret = (*mi).second.second;
            CKey key;
            if (!DecryptKey(master_key, vchCryptedSecret, vchPubKey, key))
            {
                keyFail = true;
                break;
            }
            keyPass = true;
            if (fDecryptionThoroughlyChecked)
                break;
            else {
                // Rewrite these encrypted keys with checksums
                batch.WriteCryptedKey(vchPubKey, vchCryptedSecret, mapKeyMetadata[vchPubKey.GetID()]);
            }
        }
        if (keyPass && keyFail)
        {
            LogPrintf("The wallet is probably corrupted: Some keys decrypt but not all.\n");
            throw std::runtime_error("Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt.");
        }
        if (keyFail || !keyPass)
            return false;
        fDecryptionThoroughlyChecked = true;
    }
    return true;
}